

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  TokenType TVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  string_view message;
  string_view message_00;
  string text;
  string local_a8;
  string_view local_88;
  AlphaNum local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"-",(allocator<char> *)&local_58);
  bVar2 = TryConsume(this,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
    absl::lts_20250127::AsciiStrToLower(&text);
    bVar3 = std::operator==(&text,"inf");
    dVar4 = INFINITY;
    if (!bVar3) {
      bVar3 = std::operator==(&text,"infinity");
      dVar4 = INFINITY;
      if (!bVar3) {
        bVar3 = std::operator==(&text,"nan");
        if (!bVar3) {
          local_88 = absl::lts_20250127::NullSafeStringView("Expected double, got: ");
          local_58.piece_._M_len = text._M_string_length;
          local_58.piece_._M_str = text._M_dataplus._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_a8,(lts_20250127 *)&local_88,&local_58,(AlphaNum *)text._M_string_length
                    );
          message_00._M_str = local_a8._M_dataplus._M_p;
          message_00._M_len = local_a8._M_string_length;
          ReportError(this,message_00);
          std::__cxx11::string::~string((string *)&local_a8);
          goto LAB_00271544;
        }
        dVar4 = NAN;
      }
    }
    *value = dVar4;
    io::Tokenizer::Next(&this->tokenizer_);
    std::__cxx11::string::~string((string *)&text);
  }
  else {
    if (TVar1 == TYPE_INTEGER) {
      bVar3 = ConsumeUnsignedDecimalAsDouble(this,value,0xffffffffffffffff);
      if (!bVar2 || !bVar3) {
        return bVar3;
      }
      goto LAB_002714ea;
    }
    if (TVar1 != TYPE_FLOAT) {
      local_88 = absl::lts_20250127::NullSafeStringView("Expected double, got: ");
      local_58.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_58.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&text,(lts_20250127 *)&local_88,&local_58,(AlphaNum *)local_58.piece_._M_len);
      message._M_str = text._M_dataplus._M_p;
      message._M_len = text._M_string_length;
      ReportError(this,message);
LAB_00271544:
      std::__cxx11::string::~string((string *)&text);
      return false;
    }
    dVar4 = io::Tokenizer::ParseFloat(&(this->tokenizer_).current_.text);
    *value = dVar4;
    io::Tokenizer::Next(&this->tokenizer_);
  }
  if (!bVar2) {
    return true;
  }
LAB_002714ea:
  *value = -*value;
  return true;
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError(absl::StrCat("Expected double, got: ", text));
        return false;
      }
    } else {
      ReportError(
          absl::StrCat("Expected double, got: ", tokenizer_.current().text));
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }